

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS ref_edge_rcm(REF_EDGE ref_edge,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  uint uVar1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT node;
  REF_INT nqueue;
  REF_INT ndone;
  REF_INT min_degree_node;
  REF_INT min_degree;
  REF_INT *queue;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_NODE ref_node;
  REF_INT **n2o_ptr_local;
  REF_INT **o2n_ptr_local;
  REF_EDGE ref_edge_local;
  
  o2n = &ref_edge->node->n;
  *o2n_ptr = (REF_INT *)0x0;
  *n2o_ptr = (REF_INT *)0x0;
  ref_node = (REF_NODE)n2o_ptr;
  n2o_ptr_local = o2n_ptr;
  o2n_ptr_local = (REF_INT **)ref_edge;
  if (((REF_NODE)o2n)->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x31b,
           "ref_edge_rcm","malloc o2n of REF_INT negative");
    ref_edge_local._4_4_ = 1;
  }
  else {
    n2o = (REF_INT *)malloc((long)((REF_NODE)o2n)->max << 2);
    if (n2o == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x31b,
             "ref_edge_rcm","malloc o2n of REF_INT NULL");
      ref_edge_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < o2n[1];
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        n2o[ref_private_macro_code_rss_1] = -1;
      }
      if (*o2n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x31c,"ref_edge_rcm","malloc n2o of REF_INT negative");
        ref_edge_local._4_4_ = 1;
      }
      else {
        queue = (REF_INT *)malloc((long)*o2n << 2);
        if (queue == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x31c,"ref_edge_rcm","malloc n2o of REF_INT NULL");
          ref_edge_local._4_4_ = 2;
        }
        else if (*o2n * 2 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x31d,"ref_edge_rcm","malloc queue of REF_INT negative");
          ref_edge_local._4_4_ = 1;
        }
        else {
          _min_degree_node = (REF_INT *)malloc((long)(*o2n << 1) << 2);
          if (_min_degree_node == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                   0x31d,"ref_edge_rcm","malloc queue of REF_INT NULL");
            ref_edge_local._4_4_ = 2;
          }
          else {
            node = 0;
            ref_malloc_init_i = 0;
            while (node < *o2n) {
              uVar1 = ref_edge_min_degree_node((REF_EDGE)o2n_ptr_local,n2o,&ndone,&nqueue);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x324,"ref_edge_rcm",(ulong)uVar1,"min degree node");
                return uVar1;
              }
              uVar1 = ref_edge_rcm_queue((REF_EDGE)o2n_ptr_local,nqueue,n2o,queue,&node,
                                         _min_degree_node,&ref_malloc_init_i);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x327,"ref_edge_rcm",(ulong)uVar1,"min");
                return uVar1;
              }
              while (0 < ref_malloc_init_i) {
                nqueue = _min_degree_node[(ref_malloc_init_i + -1) * 2];
                ndone = _min_degree_node[(ref_malloc_init_i + -1) * 2 + 1];
                ref_malloc_init_i = ref_malloc_init_i + -1;
                uVar1 = ref_edge_rcm_queue((REF_EDGE)o2n_ptr_local,nqueue,n2o,queue,&node,
                                           _min_degree_node,&ref_malloc_init_i);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,0x330,"ref_edge_rcm",(ulong)uVar1,"min");
                  return uVar1;
                }
              }
            }
            if ((long)node == (long)*o2n) {
              for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < node;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                _min_degree_node[(node - ref_private_macro_code_rss) + -1] =
                     queue[ref_private_macro_code_rss];
              }
              for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < node;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                queue[ref_private_macro_code_rss] = _min_degree_node[ref_private_macro_code_rss];
              }
              if (_min_degree_node != (REF_INT *)0x0) {
                free(_min_degree_node);
              }
              for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < node;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                n2o[queue[ref_private_macro_code_rss]] = ref_private_macro_code_rss;
              }
              *n2o_ptr_local = n2o;
              *(REF_INT **)ref_node = queue;
              ref_edge_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                     ,0x334,"ref_edge_rcm","reordering done not original nodes",(long)node,
                     (long)*o2n);
              ref_edge_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  return ref_edge_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_edge_rcm(REF_EDGE ref_edge, REF_INT **o2n_ptr,
                                REF_INT **n2o_ptr) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *o2n, *n2o, *queue;
  REF_INT min_degree, min_degree_node;
  REF_INT ndone, nqueue, node;

  *o2n_ptr = NULL;
  *n2o_ptr = NULL;
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc(n2o, ref_node_n(ref_node), REF_INT);
  ref_malloc(queue, 2 * ref_node_n(ref_node), REF_INT);

  ndone = 0;
  nqueue = 0;

  while (ndone < ref_node_n(ref_node)) {
    RSS(ref_edge_min_degree_node(ref_edge, o2n, &min_degree, &min_degree_node),
        "min degree node");
    RSS(ref_edge_rcm_queue(ref_edge, min_degree_node, o2n, n2o, &ndone, queue,
                           &nqueue),
        "min");

    /* drain queue */
    while (nqueue > 0) {
      min_degree_node = queue[0 + 2 * (nqueue - 1)];
      min_degree = queue[1 + 2 * (nqueue - 1)];
      nqueue--;
      RSS(ref_edge_rcm_queue(ref_edge, min_degree_node, o2n, n2o, &ndone, queue,
                             &nqueue),
          "min");
    }
  }

  REIS(ndone, ref_node_n(ref_node), "reordering done not original nodes");

  /* reverse with queue as temporary space */
  for (node = 0; node < ndone; node++) {
    queue[ndone - node - 1] = n2o[node];
  }
  /* copy back */
  for (node = 0; node < ndone; node++) {
    n2o[node] = queue[node];
  }
  ref_free(queue);

  /* set o2n to reverse */
  for (node = 0; node < ndone; node++) {
    o2n[n2o[node]] = node;
  }

  *o2n_ptr = o2n;
  *n2o_ptr = n2o;

  return REF_SUCCESS;
}